

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O3

void __thiscall xmrig::OclConfig::setPlatform(OclConfig *this,Value *platform)

{
  ushort uVar1;
  char *pcVar2;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *dst;
  
  uVar1 = (platform->data_).f.flags;
  if ((uVar1 >> 10 & 1) == 0) {
    if ((uVar1 & 0x40) != 0) {
      pcVar2 = (this->m_platformVendor).m_data;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      (this->m_platformVendor).m_data = (char *)0x0;
      (this->m_platformVendor).m_size = 0;
      this->m_platformIndex = (platform->data_).s.length;
    }
    return;
  }
  dst = (EVP_PKEY_CTX *)((ulong)(platform->data_).s.str & 0xffffffffffff);
  if ((uVar1 >> 0xc & 1) != 0) {
    dst = (EVP_PKEY_CTX *)platform;
  }
  String::copy(&this->m_platformVendor,dst,in_RDX);
  return;
}

Assistant:

void xmrig::OclConfig::setPlatform(const rapidjson::Value &platform)
{
    if (platform.IsString()) {
        m_platformVendor = platform.GetString();
    }
    else if (platform.IsUint()) {
        m_platformVendor = nullptr;
        m_platformIndex  = platform.GetUint();
    }
}